

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

_Bool observe_kill_diff(wchar_t y,wchar_t x,uint8_t a,wchar_t c)

{
  int16_t iVar1;
  borg_kill *pbVar2;
  _Bool _Var3;
  uint r_idx;
  wchar_t wVar4;
  wchar_t in_R8D;
  
  r_idx = borg_guess_race((uint8_t)y,x,(_Bool)a,c,in_R8D);
  if ((r_idx == 0) || (borg.trait[0x78] != 0)) {
    _Var3 = false;
  }
  else {
    wVar4 = borg_new_kill(r_idx,y,x);
    pbVar2 = borg_kills;
    iVar1 = borg_t;
    borg_kills[wVar4].when = borg_t;
    _Var3 = true;
    if (borg_morgoth_id == pbVar2[wVar4].r_idx) {
      borg_t_morgoth = iVar1;
    }
  }
  return _Var3;
}

Assistant:

bool observe_kill_diff(int y, int x, uint8_t a, wchar_t c)
{
    int          i;
    unsigned int r_idx;

    borg_kill *kill;

    /* Guess the race */
    r_idx = borg_guess_race(a, c, false, y, x);

    /* Oops */
    if (!r_idx)
        return false;

    /* no new monsters if hallucinations */
    if (borg.trait[BI_ISIMAGE])
        return false;

    /* Create a new monster */
    i = borg_new_kill(r_idx, y, x);

    /* Get the object */
    kill = &borg_kills[i];

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Done */
    return true;
}